

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

int Sfm_LibImplementGatesDelay
              (Sfm_Lib_t *p,int *pFanins,Mio_Gate_t *pGateB,Mio_Gate_t *pGateT,char *pFansB,
              char *pFansT,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int Entry;
  ulong uVar4;
  
  iVar1 = Mio_GateReadValue(pGateB);
  Vec_IntPush(vGates,iVar1);
  pVVar3 = Vec_WecPushLevel(vFanins);
  uVar2 = Mio_GateReadPinNum(pGateB);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      Vec_IntPush(pVVar3,pFanins[pFansB[uVar4]]);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (pGateT == (Mio_Gate_t *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = Mio_GateReadValue(pGateT);
    Vec_IntPush(vGates,iVar1);
    pVVar3 = Vec_WecPushLevel(vFanins);
    uVar2 = Mio_GateReadPinNum(pGateT);
    iVar1 = 2;
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        if ((long)pFansT[uVar4] == 0x10) {
          Entry = vFanins->nSize + -2;
        }
        else {
          Entry = pFanins[pFansT[uVar4]];
        }
        Vec_IntPush(pVVar3,Entry);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return iVar1;
}

Assistant:

int Sfm_LibImplementGatesDelay( Sfm_Lib_t * p, int * pFanins, Mio_Gate_t * pGateB, Mio_Gate_t * pGateT, char * pFansB, char * pFansT, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Vec_Int_t * vLevel;
    int i, nFanins;
    // create bottom gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateB) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateB );
    for ( i = 0; i < nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pFansB[i]] );
    if ( pGateT == NULL )
        return 1;
    // create top gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateT) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateT );
    for ( i = 0; i < nFanins; i++ )
        if ( pFansT[i] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pFansT[i]] );
    return 2;
}